

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

optional<pbrt::LightLiSample> * __thiscall
pbrt::PointLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,PointLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  Float a;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  float a_00;
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar9 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Point3<float> PVar16;
  Point3f PVar17;
  Vector3<float> VVar18;
  SampledSpectrum SVar19;
  undefined1 local_78 [16];
  SampledSpectrum local_68;
  Tuple3<pbrt::Point3,_float> local_58;
  ulong local_48;
  float local_40;
  SampledSpectrum local_38;
  undefined1 auVar13 [56];
  
  local_68.values.values[3] = local_68.values.values[1];
  local_68.values.values._0_12_ = ZEXT812(0);
  PVar16 = Transform::operator()
                     (&(this->super_LightBase).renderFromLight,(Point3<float> *)&local_68);
  auVar3._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = in_register_00001208;
  local_48 = vmovlps_avx(auVar3._0_16_);
  local_40 = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  PVar17 = LightSampleContext::p(&ctx);
  auVar4._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = in_register_00001208;
  auVar2 = vsubps_avx(auVar3._0_16_,auVar4._0_16_);
  local_78._8_8_ = auVar2._8_8_;
  auVar13 = (undefined1  [56])0x0;
  uVar1 = vmovlps_avx(auVar2);
  local_68.values.values[2] =
       PVar16.super_Tuple3<pbrt::Point3,_float>.z - PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  local_68.values.values[0] = (float)(int)uVar1;
  local_68.values.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  VVar18 = Normalize<float>((Vector3<float> *)&local_68);
  local_78._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  a = this->scale;
  auVar9 = (undefined1  [56])0x0;
  SVar19 = DenselySampledSpectrum::Sample(&this->I,&lambda);
  auVar10._0_8_ = SVar19.values.values._8_8_;
  auVar10._8_56_ = auVar13;
  auVar5._0_8_ = SVar19.values.values._0_8_;
  auVar5._8_56_ = auVar9;
  local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar10._0_16_);
  auVar9 = (undefined1  [56])0x0;
  SVar19 = SampledSpectrum::operator*(&local_38,a);
  auVar11._0_8_ = SVar19.values.values._8_8_;
  auVar11._8_56_ = auVar13;
  auVar6._0_8_ = SVar19.values.values._0_8_;
  auVar6._8_56_ = auVar9;
  local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar11._0_16_);
  auVar9 = ZEXT856(local_68.values.values._8_8_);
  PVar17 = LightSampleContext::p(&ctx);
  local_58.z = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar9;
  local_58._0_8_ = vmovlps_avx(auVar7._0_16_);
  a_00 = DistanceSquared<float>
                   ((pbrt *)&local_48,(Point3<float> *)&local_58,
                    (Point3<float> *)CONCAT44(extraout_var,extraout_EDX));
  auVar9 = extraout_var_00;
  SVar19 = SampledSpectrum::operator/(&local_68,a_00);
  auVar12._0_8_ = SVar19.values.values._8_8_;
  auVar12._8_56_ = auVar13;
  auVar8._0_8_ = SVar19.values.values._0_8_;
  auVar8._8_56_ = auVar9;
  auVar2 = vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_48;
  auVar15._4_4_ = local_40;
  auVar15._0_4_ = local_40;
  auVar15._8_4_ = local_40;
  auVar15._12_4_ = local_40;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar2;
  uVar1 = vmovlps_avx(local_78);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  auVar2 = vshufps_avx(auVar14,auVar14,0x50);
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar2;
  uVar1 = vmovlps_avx(auVar15);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        Point3f p = renderFromLight(Point3f(0, 0, 0));
        Vector3f wi = Normalize(p - ctx.p());
        SampledSpectrum Li = scale * I.Sample(lambda) / DistanceSquared(p, ctx.p());
        return LightLiSample(Li, wi, 1, Interaction(p, &mediumInterface));
    }